

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O1

int run_test_handle_fileno(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_os_fd_t fd;
  sockaddr_in addr;
  uv_idle_t idle;
  uv_udp_t udp;
  uv_tty_t tty;
  uv_tcp_t tcp;
  uv_pipe_t pipe;
  undefined1 local_4ac [4];
  undefined1 local_4a8 [16];
  char local_498 [120];
  char local_420 [216];
  char local_348 [312];
  char local_210 [248];
  char local_118 [264];
  
  pcVar2 = (char *)uv_default_loop();
  pcVar4 = "127.0.0.1";
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_4a8);
  if (iVar1 == 0) {
    pcVar4 = pcVar2;
    iVar1 = uv_idle_init(pcVar2,local_498);
    if (iVar1 != 0) goto LAB_0015cced;
    pcVar4 = local_498;
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != -0x16) goto LAB_0015ccf2;
    uv_close(local_498,0);
    pcVar4 = pcVar2;
    iVar1 = uv_tcp_init(pcVar2,local_210);
    if (iVar1 != 0) goto LAB_0015ccf7;
    pcVar4 = local_210;
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != -9) goto LAB_0015ccfc;
    pcVar4 = local_210;
    iVar1 = uv_tcp_bind(pcVar4,local_4a8,0);
    if (iVar1 != 0) goto LAB_0015cd01;
    pcVar4 = local_210;
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != 0) goto LAB_0015cd06;
    pcVar4 = local_210;
    uv_close(pcVar4,0);
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != -9) goto LAB_0015cd0b;
    pcVar4 = pcVar2;
    iVar1 = uv_udp_init(pcVar2,local_420);
    if (iVar1 != 0) goto LAB_0015cd10;
    pcVar4 = local_420;
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != -9) goto LAB_0015cd15;
    pcVar4 = local_420;
    iVar1 = uv_udp_bind(pcVar4,local_4a8,0);
    if (iVar1 != 0) goto LAB_0015cd1a;
    pcVar4 = local_420;
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != 0) goto LAB_0015cd1f;
    pcVar4 = local_420;
    uv_close(pcVar4,0);
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != -9) goto LAB_0015cd24;
    pcVar4 = pcVar2;
    iVar1 = uv_pipe_init(pcVar2,local_118,0);
    if (iVar1 != 0) goto LAB_0015cd29;
    pcVar4 = local_118;
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != -9) goto LAB_0015cd2e;
    pcVar4 = local_118;
    iVar1 = uv_pipe_bind(pcVar4,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0015cd33;
    pcVar4 = local_118;
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != 0) goto LAB_0015cd38;
    pcVar4 = local_118;
    uv_close(pcVar4,0);
    iVar1 = uv_fileno(pcVar4);
    if (iVar1 != -9) goto LAB_0015cd3d;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 < 0) {
      run_test_handle_fileno_cold_26();
LAB_0015cc96:
      uv_run(pcVar2,0);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      pcVar4 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015cd42;
    }
    pcVar4 = pcVar2;
    iVar1 = uv_tty_init(pcVar2,local_348,iVar1,0);
    if (iVar1 != 0) goto LAB_0015cd47;
    pcVar4 = local_348;
    iVar1 = uv_is_readable(pcVar4);
    if (iVar1 == 0) goto LAB_0015cd4c;
    pcVar4 = local_348;
    iVar1 = uv_is_writable(pcVar4);
    if (iVar1 != 0) goto LAB_0015cd51;
    pcVar4 = local_348;
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != 0) goto LAB_0015cd56;
    pcVar4 = local_348;
    uv_close(pcVar4,0);
    iVar1 = uv_fileno(pcVar4,local_4ac);
    if (iVar1 != -9) goto LAB_0015cd5b;
    pcVar4 = local_348;
    iVar1 = uv_is_readable(pcVar4);
    if (iVar1 == 0) {
      pcVar4 = local_348;
      iVar1 = uv_is_writable(pcVar4);
      if (iVar1 != 0) goto LAB_0015cd65;
      goto LAB_0015cc96;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0015cced:
    run_test_handle_fileno_cold_2();
LAB_0015ccf2:
    run_test_handle_fileno_cold_3();
LAB_0015ccf7:
    run_test_handle_fileno_cold_4();
LAB_0015ccfc:
    run_test_handle_fileno_cold_5();
LAB_0015cd01:
    run_test_handle_fileno_cold_6();
LAB_0015cd06:
    run_test_handle_fileno_cold_7();
LAB_0015cd0b:
    run_test_handle_fileno_cold_8();
LAB_0015cd10:
    run_test_handle_fileno_cold_9();
LAB_0015cd15:
    run_test_handle_fileno_cold_10();
LAB_0015cd1a:
    run_test_handle_fileno_cold_11();
LAB_0015cd1f:
    run_test_handle_fileno_cold_12();
LAB_0015cd24:
    run_test_handle_fileno_cold_13();
LAB_0015cd29:
    run_test_handle_fileno_cold_14();
LAB_0015cd2e:
    run_test_handle_fileno_cold_15();
LAB_0015cd33:
    run_test_handle_fileno_cold_16();
LAB_0015cd38:
    run_test_handle_fileno_cold_17();
LAB_0015cd3d:
    run_test_handle_fileno_cold_18();
LAB_0015cd42:
    run_test_handle_fileno_cold_27();
LAB_0015cd47:
    run_test_handle_fileno_cold_19();
LAB_0015cd4c:
    run_test_handle_fileno_cold_25();
LAB_0015cd51:
    run_test_handle_fileno_cold_20();
LAB_0015cd56:
    run_test_handle_fileno_cold_21();
LAB_0015cd5b:
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0015cd65:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(handle_fileno) {
  int r;
  int tty_fd;
  struct sockaddr_in addr;
  uv_os_fd_t fd;
  uv_tcp_t tcp;
  uv_udp_t udp;
  uv_pipe_t pipe;
  uv_tty_t tty;
  uv_idle_t idle;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_idle_init(loop, &idle);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &idle, &fd);
  ASSERT(r == UV_EINVAL);
  uv_close((uv_handle_t*) &idle, NULL);

  r = uv_tcp_init(loop, &tcp);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_tcp_bind(&tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &tcp, NULL);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == UV_EBADF);

  r = uv_udp_init(loop, &udp);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_udp_bind(&udp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &udp, NULL);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_init(loop, &pipe, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_pipe_bind(&pipe, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &pipe, NULL);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == UV_EBADF);

  tty_fd = get_tty_fd();
  if (tty_fd < 0) {
    fprintf(stderr, "Cannot open a TTY fd");
    fflush(stderr);
  } else {
    r = uv_tty_init(loop, &tty, tty_fd, 0);
    ASSERT(r == 0);
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &tty, NULL);
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT(r == UV_EBADF);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}